

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::AbstractDOMParser::docCharacters
          (AbstractDOMParser *this,XMLCh *chars,XMLSize_t length,bool cdataSection)

{
  int iVar1;
  undefined4 extraout_var;
  DOMParentNode *pDVar2;
  undefined4 extraout_var_00;
  DOMText *node_2;
  DOMTextImpl *node_1;
  DOMCDATASection *node;
  bool cdataSection_local;
  XMLSize_t length_local;
  XMLCh *chars_local;
  AbstractDOMParser *this_local;
  
  if ((this->fWithinElement & 1U) != 0) {
    if (cdataSection) {
      iVar1 = (*(this->super_XMLDocumentHandler)._vptr_XMLDocumentHandler[0x22])(this,chars,length);
      pDVar2 = castToParentImpl(this->fCurrentParent);
      (**pDVar2->_vptr_DOMParentNode)(pDVar2,(DOMNode *)CONCAT44(extraout_var,iVar1));
      this->fCurrentNode = (DOMNode *)CONCAT44(extraout_var,iVar1);
    }
    else {
      iVar1 = (*this->fCurrentNode->_vptr_DOMNode[4])();
      if (iVar1 == 3) {
        DOMTextImpl::appendDataFast((DOMTextImpl *)this->fCurrentNode,chars,length);
      }
      else {
        iVar1 = (*(this->super_XMLDocumentHandler)._vptr_XMLDocumentHandler[0x23])
                          (this,chars,length);
        pDVar2 = castToParentImpl(this->fCurrentParent);
        (**pDVar2->_vptr_DOMParentNode)(pDVar2,(DOMNode *)CONCAT44(extraout_var_00,iVar1));
        this->fCurrentNode = (DOMNode *)CONCAT44(extraout_var_00,iVar1);
      }
    }
  }
  return;
}

Assistant:

void AbstractDOMParser::docCharacters(  const   XMLCh* const    chars
                              , const XMLSize_t    length
                              , const bool         cdataSection)
{
    // Ignore chars outside of content
    if (!fWithinElement)
        return;

    if (cdataSection == true)
    {
        DOMCDATASection *node = createCDATASection (chars, length);
        castToParentImpl (fCurrentParent)->appendChildFast (node);
        fCurrentNode = node;
    }
    else
    {
        if (fCurrentNode->getNodeType() == DOMNode::TEXT_NODE)
        {
            DOMTextImpl *node = (DOMTextImpl*)fCurrentNode;
            node->appendDataFast(chars, length);
        }
        else
        {
            DOMText *node = createText (chars, length);
            castToParentImpl (fCurrentParent)->appendChildFast (node);
            fCurrentNode = node;
        }
    }
}